

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O3

void __thiscall
kratos::PassManager::register_pass
          (PassManager *this,string *name,function<void_(kratos::Generator_*)> *fn)

{
  const_iterator cVar1;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pointer local_58;
  size_type sStack_50;
  string local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
                  *)this,name);
  if (cVar1._M_node == (_Base_ptr)(this + 8)) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::function<void(kratos::Generator*)>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>>
                *)this,name,fn);
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_58 = (name->_M_dataplus)._M_p;
  sStack_50 = name->_M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x26;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_40,(detail *)"{0} already exists in the pass manager",format_str,args);
  UserException::UserException(this_00,&local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PassManager::register_pass(const std::string& name, std::function<void(Generator*)> fn) {
    if (has_pass(name))
        throw UserException(::format("{0} already exists in the pass manager", name));
    passes_.emplace(name, std::move(fn));
}